

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool cppcms::xss::validate_and_filter_if_invalid
               (char *begin,char *end,rules *r,string *output,filtering_method_type method,
               char repl_ch)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  long lVar4;
  reference pvVar5;
  string *in_RCX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  rules *in_stack_00000030;
  entry *in_stack_00000038;
  string tmp_2;
  char c;
  char *p;
  char *e;
  char *b;
  uint i_3;
  int pair;
  uint i_2;
  uint i_1;
  uint i;
  size_t size;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  parsed;
  string tmp_1;
  string tmp;
  string filtered;
  string filtered_input;
  string work_input;
  string work_encoding;
  string real_encoding;
  bool valid;
  rules *in_stack_fffffffffffffe18;
  entry *in_stack_fffffffffffffe20;
  string *psVar6;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  string local_198 [39];
  char local_171;
  char *local_170;
  char *local_168;
  char *local_160;
  uint local_158;
  undefined4 local_154;
  int local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  ulong local_140;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  local_138 [2];
  string local_100 [32];
  string local_e0 [15];
  undefined1 in_stack_ffffffffffffff2f;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *in_stack_ffffffffffffff30;
  string local_c0 [31];
  char in_stack_ffffffffffffff5f;
  string *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string local_70 [32];
  string local_50 [34];
  byte local_2e;
  undefined1 local_2d;
  int local_2c;
  string *local_28;
  string *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  byte local_1;
  
  local_2e = 1;
  local_2d = in_R9B;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  rules::encoding_abi_cxx11_((rules *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
  ;
  std::__cxx11::string::string(local_70,local_50);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60);
  std::__cxx11::string::string(local_c0);
  std::__cxx11::string::string(local_e0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = encoding::is_ascii_compatible((string *)0x45cd38);
    if (!bVar1) {
      std::__cxx11::string::operator=(local_70,"UTF-8");
      local_2d = 0;
      booster::locale::conv::to_utf<char>
                ((char *)local_100,(char *)local_10,local_18,(method_type)local_50);
      std::__cxx11::string::swap((string *)&stack0xffffffffffffff60);
      std::__cxx11::string::~string(local_100);
      in_stack_fffffffffffffe48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::c_str();
      local_10 = in_stack_fffffffffffffe48;
      lVar4 = std::__cxx11::string::size();
      local_18 = (string *)(&in_stack_fffffffffffffe48->_M_dataplus + lVar4);
    }
    in_stack_fffffffffffffe47 =
         encoding::validate_or_filter
                   (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                    in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
    if (!(bool)in_stack_fffffffffffffe47) {
      local_2e = 0;
      in_stack_fffffffffffffe38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::c_str();
      local_10 = in_stack_fffffffffffffe38;
      lVar4 = std::__cxx11::string::size();
      local_18 = (string *)(&in_stack_fffffffffffffe38->_M_dataplus + lVar4);
    }
  }
  this = local_138;
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::vector((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            *)0x45cf70);
  anon_unknown_8::split_to_parts
            ((char *)work_input.field_2._8_8_,(char *)work_input.field_2._M_allocated_capacity,
             (vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              *)work_input._M_string_length);
  local_140 = std::
              vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::size(local_138);
  for (local_144 = 0; local_144 < local_140; local_144 = local_144 + 1) {
    pvVar5 = std::
             vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             ::operator[](local_138,(ulong)local_144);
    if (pvVar5->type == invalid_data) {
      local_2e = 0;
    }
    std::
    vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    ::operator[](local_138,(ulong)local_144);
    anon_unknown_8::parse_part(in_stack_fffffffffffffe20);
    pvVar5 = std::
             vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             ::operator[](local_138,(ulong)local_144);
    if (pvVar5->type == invalid_data) {
      local_2e = 0;
    }
  }
  rules::html(in_stack_fffffffffffffe18);
  anon_unknown_8::validate_nesting(in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  for (local_148 = 0; local_148 < local_140; local_148 = local_148 + 1) {
    pvVar5 = std::
             vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             ::operator[](local_138,(ulong)local_148);
    if (pvVar5->type == invalid_data) {
      local_2e = 0;
    }
  }
  for (local_14c = 0; local_14c < local_140; local_14c = local_14c + 1) {
    std::
    vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    ::operator[](local_138,(ulong)local_14c);
    bVar1 = anon_unknown_8::validate_entry_by_rules(in_stack_00000038,in_stack_00000030);
    if (!bVar1) {
      local_2e = 0;
      pvVar5 = std::
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               ::operator[](local_138,(ulong)local_14c);
      local_150 = (pvVar5->tag).pair;
      if (local_150 != -1) {
        pvVar5 = std::
                 vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                 ::operator[](local_138,(long)local_150);
        pvVar5->type = invalid_data;
      }
      pvVar5 = std::
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               ::operator[](local_138,(ulong)local_14c);
      pvVar5->type = invalid_data;
    }
  }
  if ((local_2e & 1) == 0) {
    psVar6 = local_e0;
    std::__cxx11::string::clear();
    std::__cxx11::string::reserve((ulong)psVar6);
    for (local_158 = 0; local_158 < local_140; local_158 = local_158 + 1) {
      pvVar5 = std::
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               ::operator[](local_138,(ulong)local_158);
      local_160 = pvVar5->begin;
      pvVar5 = std::
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               ::operator[](local_138,(ulong)local_158);
      local_168 = pvVar5->end;
      pvVar5 = std::
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               ::operator[](local_138,(ulong)local_158);
      if (pvVar5->type == invalid_data) {
        if (local_2c != 0) {
          for (local_170 = local_160; local_170 != local_168; local_170 = local_170 + 1) {
            local_171 = *local_170;
            switch(local_171) {
            case '\"':
              std::__cxx11::string::operator+=(local_e0,"&quot;");
              break;
            default:
              std::__cxx11::string::operator+=(local_e0,local_171);
              break;
            case '&':
              std::__cxx11::string::operator+=(local_e0,"&amp;");
              break;
            case '<':
              std::__cxx11::string::operator+=(local_e0,"&lt;");
              break;
            case '>':
              std::__cxx11::string::operator+=(local_e0,"&gt;");
            }
          }
        }
      }
      else {
        std::__cxx11::string::append((char *)local_e0,(ulong)local_160);
      }
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe38);
    if (_Var2) {
      std::__cxx11::string::swap(local_28);
    }
    else {
      booster::locale::conv::from_utf<char>
                (in_stack_fffffffffffffe48,
                 (string *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (method_type)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      std::__cxx11::string::swap(local_28);
      std::__cxx11::string::~string(local_198);
    }
    local_1 = 0;
  }
  else {
    local_1 = 1;
  }
  local_154 = 1;
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::~vector(this);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool validate_and_filter_if_invalid(	char const *begin,
						char const *end,
						rules const &r,
						std::string &output,
						filtering_method_type method,
						char repl_ch)
	{
		bool valid = true;
		
		std::string real_encoding = r.encoding();
		std::string work_encoding = real_encoding;

		std::string work_input;
		std::string filtered_input;
		std::string filtered;

		if(!real_encoding.empty()) {
			if(!encoding::is_ascii_compatible(real_encoding)) { 
				work_encoding = "UTF-8";
				repl_ch = 0;
				try {
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::stop
							);
					work_input.swap(tmp);
				}
				catch(...) {
					valid = false;
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::skip
							);
					work_input.swap(tmp);
				}
				begin = work_input.c_str();
				end = begin + work_input.size();
			}

			if(!encoding::validate_or_filter(work_encoding,begin,end,filtered_input,repl_ch)) {
				valid = false;
				begin = filtered_input.c_str();
				end = begin + filtered_input.size();
			}
		}

		std::vector<entry> parsed;
		
		split_to_parts(begin,end,parsed);

		size_t size = parsed.size();

		for(unsigned i=0;i<size;i++) {
			if(parsed[i].type == invalid_data)
				valid = false;
			parse_part(parsed[i]);
			if(parsed[i].type == invalid_data)
				valid = false;
		}

		validate_nesting(parsed,r.html() == rules::xhtml_input);

		for(unsigned i=0;i<size;i++)
			if(parsed[i].type == invalid_data)
				valid = false;

		for(unsigned i=0;i<size;i++) {
			if(!validate_entry_by_rules(parsed[i],r)) {
				valid = false;
				int pair = parsed[i].tag.pair;
				if(pair!=-1)
					parsed[pair].type = invalid_data;
				parsed[i].type = invalid_data;
			}
		}
		if(valid)
			return true;
		
		filtered.clear();
		filtered.reserve(end-begin);
		
		for(unsigned i=0;i<size;i++) {
			char const *b=parsed[i].begin;
			char const *e=parsed[i].end;
			if(parsed[i].type == invalid_data) {
				if(method == remove_invalid)
					continue;
				for(char const *p=b;p!=e;p++) {
					char c=*p;
					switch(c) {
					case '<':
						filtered+="&lt;";
						break;
					case '>':
						filtered+="&gt;";
						break;
					case '&':
						filtered+="&amp;";
						break;
					case '"':
						filtered+="&quot;";
						break;
					default:
						filtered+=c;
					}
				}
			}
			else {
				filtered.append(b,e-b);
			}
		}

		if(work_encoding == real_encoding) {
			output.swap(filtered);
		}
		else {
			try {
				std::string tmp = booster::locale::conv::from_utf<char>(
						filtered,
						real_encoding,
						booster::locale::conv::stop);
				output.swap(tmp);
			}
			catch(...) {
				// Nothing to do
			}
		}
		return false;
	}